

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::update_scrape_state(torrent *this)

{
  bool bVar1;
  reference paVar2;
  reference paVar3;
  const_iterator ppVar4;
  value_type *pvVar5;
  int *piVar6;
  uint *puVar7;
  value_type *a;
  protocol_version ih;
  const_iterator __end4;
  const_iterator __begin4;
  initializer_list<libtorrent::protocol_version> *__range4;
  announce_endpoint *aep;
  const_iterator __end3;
  const_iterator __begin3;
  vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
  *__range3;
  announce_entry *t;
  iterator __end2;
  iterator __begin2;
  tracker_list *__range2;
  uint local_18;
  int downloaded;
  int incomplete;
  int complete;
  torrent *this_local;
  
  downloaded = -1;
  local_18 = 0xffffffff;
  __range2._4_4_ = 0xffffffff;
  _incomplete = this;
  tracker_list::begin((tracker_list *)&__end2);
  tracker_list::end((tracker_list *)&t);
  while( true ) {
    bVar1 = boost::intrusive::operator!=
                      (&__end2,(list_iterator<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_false>
                                *)&t);
    if (!bVar1) break;
    paVar2 = boost::intrusive::
             list_iterator<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_false>
             ::operator*(&__end2);
    __end3 = ::std::
             vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
             ::begin(&paVar2->endpoints);
    aep = (announce_endpoint *)
          ::std::
          vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
          ::end(&paVar2->endpoints);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end3,(__normal_iterator<const_libtorrent::aux::announce_endpoint_*,_std::vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>_>
                                  *)&aep);
      if (!bVar1) break;
      paVar3 = __gnu_cxx::
               __normal_iterator<const_libtorrent::aux::announce_endpoint_*,_std::vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>_>
               ::operator*(&__end3);
      __end4 = ::std::initializer_list<libtorrent::protocol_version>::begin
                         ((initializer_list<libtorrent::protocol_version> *)
                          libtorrent::(anonymous_namespace)::all_versions);
      ppVar4 = ::std::initializer_list<libtorrent::protocol_version>::end
                         ((initializer_list<libtorrent::protocol_version> *)
                          libtorrent::(anonymous_namespace)::all_versions);
      for (; __end4 != ppVar4; __end4 = __end4 + 1) {
        pvVar5 = container_wrapper<libtorrent::aux::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::aux::announce_infohash,_2UL>_>
                 ::operator[](&paVar3->info_hashes,*__end4);
        piVar6 = ::std::max<int>(&pvVar5->scrape_complete,&downloaded);
        downloaded = *piVar6;
        puVar7 = (uint *)::std::max<int>(&pvVar5->scrape_incomplete,(int *)&local_18);
        local_18 = *puVar7;
        puVar7 = (uint *)::std::max<int>(&pvVar5->scrape_downloaded,(int *)((long)&__range2 + 4));
        __range2._4_4_ = *puVar7;
      }
      __gnu_cxx::
      __normal_iterator<const_libtorrent::aux::announce_endpoint_*,_std::vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>_>
      ::operator++(&__end3);
    }
    boost::intrusive::
    list_iterator<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_false>
    ::operator++(&__end2);
  }
  if ((((-1 < downloaded) &&
       (((uint)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 & 0xffffff) !=
        downloaded)) ||
      ((-1 < (int)local_18 && ((*(uint *)&this->field_0x5dd & 0xffffff) != local_18)))) ||
     ((-1 < (int)__range2._4_4_ && ((*(uint *)&this->field_0x600 >> 7 & 0xffffff) != __range2._4_4_)
      ))) {
    state_updated(this);
  }
  if (((((uint)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 & 0xffffff) !=
        downloaded) || ((*(uint *)&this->field_0x5dd & 0xffffff) != local_18)) ||
     ((*(uint *)&this->field_0x600 >> 7 & 0xffffff) != __range2._4_4_)) {
    *(ulong *)&(this->super_torrent_hot_members).field_0x48 =
         *(ulong *)&(this->super_torrent_hot_members).field_0x48 & 0xffffffffff000000 |
         (ulong)(uint)downloaded & 0xffffff;
    *(uint *)&this->field_0x5dd = *(uint *)&this->field_0x5dd & 0xff000000 | local_18 & 0xffffff;
    *(uint *)&this->field_0x600 =
         *(uint *)&this->field_0x600 & 0x8000007f | (__range2._4_4_ & 0xffffff) << 7;
    update_auto_sequential(this);
    set_need_save_resume(this,(resume_data_flags_t)0x8);
  }
  return;
}

Assistant:

void torrent::update_scrape_state()
	{
		// loop over all trackers and find the largest numbers for each scrape field
		// then update the torrent-wide understanding of number of downloaders and seeds
		int complete = -1;
		int incomplete = -1;
		int downloaded = -1;
		for (auto const& t : m_trackers)
		{
			for (auto const& aep : t.endpoints)
			{
				for (protocol_version const ih : all_versions)
				{
					auto const& a = aep.info_hashes[ih];
					complete = std::max(a.scrape_complete, complete);
					incomplete = std::max(a.scrape_incomplete, incomplete);
					downloaded = std::max(a.scrape_downloaded, downloaded);
				}
			}
		}

		if ((complete >= 0 && int(m_complete) != complete)
			|| (incomplete >= 0 && int(m_incomplete) != incomplete)
			|| (downloaded >= 0 && int(m_downloaded) != downloaded))
			state_updated();

		if (int(m_complete) != complete
			|| int(m_incomplete) != incomplete
			|| int(m_downloaded) != downloaded)
		{
			m_complete = std::uint32_t(complete);
			m_incomplete = std::uint32_t(incomplete);
			m_downloaded = std::uint32_t(downloaded);

			update_auto_sequential();

			// these numbers are cached in the resume data
			set_need_save_resume(torrent_handle::if_counters_changed);
		}
	}